

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dumper.cpp
# Opt level: O3

void __thiscall arangodb::velocypack::Dumper::handleUnsupportedType(Dumper *this,Slice slice)

{
  UnsupportedTypeBehavior UVar1;
  Sink *pSVar2;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  Exception *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  size_type *local_60;
  size_type local_58;
  size_type local_50;
  undefined4 uStack_48;
  undefined4 uStack_44;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  UVar1 = this->options->unsupportedTypeBehavior;
  if (UVar1 == ConvertUnsupportedType) {
    pSVar2 = this->_sink;
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"\"(non-representable type ","");
    __s = valueTypeName(SliceStaticData::TypeMap[*slice._start]);
    pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_40,__s);
    local_80._M_dataplus._M_p = (pbVar3->_M_dataplus)._M_p;
    paVar4 = &pbVar3->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p == paVar4) {
      local_80.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
      local_80.field_2._8_8_ = *(undefined8 *)((long)&pbVar3->field_2 + 8);
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    }
    else {
      local_80.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
    }
    local_80._M_string_length = pbVar3->_M_string_length;
    (pbVar3->_M_dataplus)._M_p = (pointer)paVar4;
    pbVar3->_M_string_length = 0;
    (pbVar3->field_2)._M_local_buf[0] = '\0';
    pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_80,")\"");
    local_60 = (size_type *)(pbVar3->_M_dataplus)._M_p;
    paVar4 = &pbVar3->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60 == paVar4) {
      local_50 = paVar4->_M_allocated_capacity;
      uStack_48 = *(undefined4 *)((long)&pbVar3->field_2 + 8);
      uStack_44 = *(undefined4 *)((long)&pbVar3->field_2 + 0xc);
      local_60 = &local_50;
    }
    else {
      local_50 = paVar4->_M_allocated_capacity;
    }
    local_58 = pbVar3->_M_string_length;
    (pbVar3->_M_dataplus)._M_p = (pointer)paVar4;
    pbVar3->_M_string_length = 0;
    (pbVar3->field_2)._M_local_buf[0] = '\0';
    (*pSVar2->_vptr_Sink[5])(pSVar2);
    if (local_60 != &local_50) {
      operator_delete(local_60,local_50 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  if (UVar1 == NullifyUnsupportedType) {
    (*this->_sink->_vptr_Sink[3])(this->_sink,"null",4);
    return;
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x18);
  Exception::Exception(this_00,NoJsonEquivalent);
  __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

void Dumper::handleUnsupportedType(Slice slice) {
  if (options->unsupportedTypeBehavior == Options::NullifyUnsupportedType) {
    _sink->append("null", 4);
    return;
  } else if (options->unsupportedTypeBehavior ==
             Options::ConvertUnsupportedType) {
    _sink->append(std::string("\"(non-representable type ") + slice.typeName() +
                  ")\"");
    return;
  }

  throw Exception(Exception::NoJsonEquivalent);
}